

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O2

void __thiscall iDynTree::optimalcontrol::MeshPointOrigin::MeshPointOrigin(MeshPointOrigin *this)

{
  allocator<char> local_12;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"ERROR",&local_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_description,"A meshPointOrigin not initialized",&local_12);
  this->m_priority = -1;
  return;
}

Assistant:

MeshPointOrigin()
            :m_name("ERROR")
            ,m_description("A meshPointOrigin not initialized")
            ,m_priority(-1)
            {}